

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall E64::stats_t::process_parameters(stats_t *this)

{
  double dVar1;
  byte bVar2;
  uint8_t uVar3;
  byte bVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  bVar4 = this->framecounter + 1;
  this->framecounter = bVar4;
  bVar2 = this->framecounter_interval;
  if (bVar4 == bVar2) {
    this->framecounter = '\0';
    dVar7 = (double)((uint)bVar2 * 1000000) / (double)this->total_time;
    this->framerate = dVar7;
    dVar1 = this->alpha;
    dVar6 = 1.0 - dVar1;
    this->smoothed_framerate = this->smoothed_framerate * dVar1 + dVar7 * dVar6;
    uVar5 = (ulong)(uint)bVar2;
    dVar7 = (double)(this->total_sound_time / (long)uVar5);
    this->sound_per_frame = dVar7;
    dVar9 = (double)(this->total_core_time / (long)uVar5);
    this->core_per_frame = dVar9;
    dVar10 = (double)(this->total_textures_time / (long)uVar5);
    this->textures_per_frame = dVar10;
    dVar11 = (double)(this->total_idle_time / (long)uVar5);
    this->idle_per_frame = dVar11;
    dVar8 = this->smoothed_sound_per_frame * dVar1 + dVar7 * dVar6;
    this->smoothed_sound_per_frame = dVar8;
    dVar7 = this->smoothed_core_per_frame * dVar1 + dVar9 * dVar6;
    this->smoothed_core_per_frame = dVar7;
    dVar9 = this->smoothed_textures_per_frame * dVar1 + dVar10 * dVar6;
    this->smoothed_textures_per_frame = dVar9;
    dVar10 = this->smoothed_idle_per_frame * dVar1 + dVar11 * dVar6;
    this->smoothed_idle_per_frame = dVar10;
    this->smoothed_audio_queue_size_bytes =
         dVar1 * this->smoothed_audio_queue_size_bytes + dVar6 * this->audio_queue_size_bytes;
    dVar9 = dVar7 + dVar8 + dVar9;
    this->cpu_percentage = (dVar9 * 100.0) / (dVar9 + dVar10);
    this->total_core_time = 0;
    this->total_textures_time = 0;
    this->total_time = 0;
    this->total_sound_time = 0;
    this->total_idle_time = 0;
  }
  uVar3 = this->status_bar_framecounter + '\x01';
  this->status_bar_framecounter = uVar3;
  if (uVar3 == this->status_bar_framecounter_interval) {
    this->status_bar_framecounter = '\0';
    snprintf(this->statistics_string,0x100,
             "\n      sound: %5.2f ms     cpu load:%6.2f %%\n       core: %5.2f ms  audiobuffer: %5.2f kb\n   textures: %5.2f ms    framerate:%6.2f fps\n  frametime: %5.2f ms"
             ,this->smoothed_sound_per_frame / 1000.0,this->cpu_percentage,
             this->smoothed_core_per_frame / 1000.0,
             this->smoothed_audio_queue_size_bytes * 0.0009765625,
             this->smoothed_textures_per_frame / 1000.0,this->smoothed_framerate,
             (this->smoothed_sound_per_frame + this->smoothed_core_per_frame +
              this->smoothed_textures_per_frame + this->smoothed_idle_per_frame) / 1000.0);
    return;
  }
  return;
}

Assistant:

void E64::stats_t::process_parameters()
{
	framecounter++;
	
	if (framecounter == framecounter_interval) {
		framecounter = 0;

		framerate = (double)(framecounter_interval * 1000000) / total_time;
		
		smoothed_framerate =
			(alpha * smoothed_framerate) +
			((1.0 - alpha) * framerate);
        
		sound_per_frame = total_sound_time / framecounter_interval;
		core_per_frame = total_core_time / framecounter_interval;
		textures_per_frame = total_textures_time / framecounter_interval;
		idle_per_frame = total_idle_time / framecounter_interval;
		
		smoothed_sound_per_frame =
			(alpha * smoothed_sound_per_frame) +
			((1.0 - alpha) * sound_per_frame);
		
		smoothed_core_per_frame =
			(alpha * smoothed_core_per_frame) +
			((1.0 - alpha) * core_per_frame);
		
		smoothed_textures_per_frame =
			(alpha * smoothed_textures_per_frame) +
			((1.0 - alpha) * textures_per_frame);
		
		smoothed_idle_per_frame =
			(alpha * smoothed_idle_per_frame) +
			((1.0 - alpha) * idle_per_frame);
		
		smoothed_audio_queue_size_bytes =
			(alpha * smoothed_audio_queue_size_bytes) +
			((1.0 - alpha) * audio_queue_size_bytes);
		
		cpu_percentage = 100 * (smoothed_sound_per_frame + smoothed_core_per_frame + smoothed_textures_per_frame) / (smoothed_sound_per_frame + smoothed_core_per_frame + smoothed_textures_per_frame + smoothed_idle_per_frame);
        
		total_time = total_sound_time = total_core_time = total_textures_time = total_idle_time = 0;
	}

	status_bar_framecounter++;

	if (status_bar_framecounter == status_bar_framecounter_interval) {
		status_bar_framecounter = 0;

		snprintf(statistics_string, 256,
			"\n      sound: %5.2f ms     cpu load:%6.2f %%\n"
			"       core: %5.2f ms  audiobuffer: %5.2f kb\n"
			"   textures: %5.2f ms    framerate:%6.2f fps\n"
			"  frametime: %5.2f ms",
			smoothed_sound_per_frame/1000, cpu_percentage,
			smoothed_core_per_frame/1000, smoothed_audio_queue_size_bytes/1024,
			 smoothed_textures_per_frame/1000, smoothed_framerate,
			 (smoothed_sound_per_frame+smoothed_core_per_frame+smoothed_textures_per_frame+smoothed_idle_per_frame)/1000);
	}
}